

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# safe_list.h
# Opt level: O3

void __thiscall
obs::safe_list<obs::slot<int_()>_>::delete_nodes(safe_list<obs::slot<int_()>_> *this,bool all)

{
  node *pnVar1;
  int iVar2;
  node *pnVar3;
  node *pnVar4;
  node *pnVar5;
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)this);
  if (iVar2 != 0) {
    std::__throw_system_error(iVar2);
  }
  if ((all) || (this->m_delete_nodes == true)) {
    if (this->m_first != (node *)0x0) {
      pnVar4 = this->m_first;
      pnVar5 = (node *)0x0;
      do {
        pnVar1 = pnVar4->next;
        if ((all) || ((pnVar3 = pnVar4, pnVar4->value == (slot<int_()> *)0x0 && (pnVar4->locks == 0)
                      ))) {
          if (pnVar5 == (node *)0x0) {
            this->m_first = pnVar1;
            pnVar3 = pnVar1;
          }
          else {
            pnVar5->next = pnVar1;
            pnVar3 = pnVar5;
          }
          if (pnVar4 == this->m_last) {
            this->m_last = pnVar3;
          }
          if (pnVar4->locks != 0) {
            __assert_fail("!node->locks",
                          "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]observable/./obs/safe_list.h"
                          ,0x186,
                          "void obs::safe_list<obs::slot<int ()>>::delete_nodes(bool) [T = obs::slot<int ()>]"
                         );
          }
          operator_delete(pnVar4);
          pnVar3 = pnVar5;
        }
        pnVar4 = pnVar1;
        pnVar5 = pnVar3;
      } while (pnVar1 != (node *)0x0);
    }
    this->m_delete_nodes = false;
  }
  pthread_mutex_unlock((pthread_mutex_t *)this);
  return;
}

Assistant:

void delete_nodes(bool all) {
    std::lock_guard<std::mutex> lock(m_mutex_nodes);
    if (!all && !m_delete_nodes)
      return;

    node* prev = nullptr;
    node* next = nullptr;

    for (node* node=m_first; node; node=next) {
      next = node->next;

      if (all || (!node->value && !node->locks)) {
        if (prev) {
          prev->next = next;
          if (node == m_last)
            m_last = prev;
        }
        else {
          m_first = next;
          if (node == m_last)
            m_last = m_first;
        }

        assert(!node->locks);
        delete node;
      }
      else {
        prev = node;
      }
    }

    m_delete_nodes = false;
  }